

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O0

bool template_image::Constructor(void)

{
  uchar colorCount_00;
  uchar alignment_00;
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint8_t alignment;
  uint8_t colorCount;
  uint32_t height;
  uint32_t width;
  uint32_t i;
  uint in_stack_ffffffffffffffa4;
  undefined2 uVar4;
  uint in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffac;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffb4;
  uint8_t in_stack_ffffffffffffffc2;
  uint8_t in_stack_ffffffffffffffc3;
  uint32_t in_stack_ffffffffffffffc4;
  uint32_t in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffd0;
  uint local_8;
  
  local_8 = 0;
  while( true ) {
    uVar4 = (undefined2)(in_stack_ffffffffffffffa4 >> 0x10);
    uVar5 = local_8;
    uVar2 = Test_Helper::runCount();
    if (uVar2 <= uVar5) {
      return true;
    }
    in_stack_ffffffffffffffa4 = Test_Helper::randomValue<unsigned_int>(0x18c255);
    uVar3 = Test_Helper::randomValue<unsigned_int>(0x18c262);
    uVar2 = 1;
    colorCount_00 = Test_Helper::randomValue<unsigned_char>((uchar)uVar4,1);
    alignment_00 = Test_Helper::randomValue<unsigned_char>((uchar)uVar4,uVar2);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,(uint8_t)((ushort)uVar4 >> 8),
               (uint8_t)uVar4);
    in_stack_ffffffffffffffac =
         Unit_Test::rowSize(in_stack_ffffffffffffffa4,colorCount_00,alignment_00);
    bVar1 = Unit_Test::equalSize<PenguinV_Image::ImageTemplate<unsigned_char>>
                      (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                       ,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc3,
                       in_stack_ffffffffffffffc2);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x18c30d);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    local_8 = local_8 + 1;
    in_stack_ffffffffffffffa8 = uVar3;
  }
  return false;
}

Assistant:

bool Constructor()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width      = Unit_Test::randomValue<uint32_t>( 2048 );
            const uint32_t height     = Unit_Test::randomValue<uint32_t>( 2048 );
            const uint8_t  colorCount = Unit_Test::randomValue<uint8_t >( 1, 4 );
            const uint8_t  alignment  = Unit_Test::randomValue<uint8_t >( 1, 32 );

            if( !Unit_Test::equalSize( PenguinV_Image::ImageTemplate < uint8_t >( width, height, colorCount, alignment ), width, height,
                                       Unit_Test::rowSize( width, colorCount, alignment ), colorCount, alignment ) )
                return false;
        }

        return true;
    }